

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-25-default-values.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  const_iterator cVar4;
  const_reference pvVar5;
  ostream *poVar6;
  uint uVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *__const_this;
  long lVar8;
  char *pcVar9;
  json_validator validator;
  json person_emtpy_address;
  json default_patch;
  json person_missing_address;
  _Any_data local_108;
  _Manager_type local_f8;
  undefined8 uStack_f0;
  undefined1 local_e0 [8];
  json_value local_d8;
  long *local_d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  long *local_b8 [2];
  long local_a8 [2];
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  nlohmann::json_schema::json_validator::json_validator
            ((json_validator *)local_e0,(schema_loader *)&local_58,(format_checker *)&local_78,
             (content_checker *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  nlohmann::json_schema::json_validator::set_root_schema
            ((json_validator *)local_e0,&person_schema_abi_cxx11_);
  local_f8 = (_Manager_type)0x0;
  uStack_f0 = 0;
  local_108._M_unused._M_object = (_Manager_type *)0x0;
  local_108._8_8_ = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<char_const*>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)(local_e0 + 8),
             "{\n\t\t\"name\": \"Hans\",\n\t\t\"age\": 69,\n\t\t\"address\": {}\n\t\t}","",
             (parser_callback_t *)&local_108,true,false);
  if (local_f8 != (_Manager_type)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  nlohmann::json_schema::json_validator::validate((json_validator *)&local_c8,(json *)local_e0);
  if (local_c8.m_type == array) {
    if ((long)((local_c8.m_value.array)->
              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)((local_c8.m_value.array)->
              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start != 0x10) {
      lVar8 = 0x39;
      pcVar9 = "Patch with defaults is expected to contain one opperation";
      goto LAB_00108b07;
    }
    pvVar3 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](&local_c8,0);
    lVar8 = 0x3b;
    pcVar9 = "Patch with defaults is expected to contain opperation entry";
    if (pvVar3->m_type == object) {
      cVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[3],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(pvVar3->m_value).object,(char (*) [3])"op");
      if ((_Rb_tree_header *)cVar4._M_node !=
          &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
        pvVar5 = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)pvVar3,"op");
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_108,pvVar5);
        iVar2 = std::__cxx11::string::compare(local_108._M_pod_data);
        if ((_Manager_type *)local_108._M_unused._0_8_ != &local_f8) {
          operator_delete(local_108._M_unused._M_object,(ulong)(local_f8 + 1));
        }
        if (iVar2 == 0) {
          lVar8 = 0x31;
          pcVar9 = "Patch with defaults is expected to contain a path";
          if (pvVar3->m_type == object) {
            cVar4 = std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                    ::_M_find_tr<char[5],void>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                *)(pvVar3->m_value).object,(char (*) [5])0x13fbc7);
            if ((_Rb_tree_header *)cVar4._M_node !=
                &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
              pvVar5 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)pvVar3,"path");
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_108,pvVar5);
              iVar2 = std::__cxx11::string::compare(local_108._M_pod_data);
              if (iVar2 == 0) {
                lVar8 = 0x32;
                pcVar9 = "Patch with defaults is expected to contain a value";
                if (pvVar3->m_type != object) {
LAB_00108d12:
                  poVar6 = (ostream *)&std::cerr;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar9,lVar8);
                  goto LAB_00108d27;
                }
                cVar4 = std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        ::_M_find_tr<char[6],void>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                    *)(pvVar3->m_value).object,(char (*) [6])0x13fc49);
                if ((_Rb_tree_header *)cVar4._M_node ==
                    &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)
                goto LAB_00108d12;
                pvVar3 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)pvVar3,"value");
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (local_b8,pvVar3);
                iVar2 = std::__cxx11::string::compare((char *)local_b8);
                if (local_b8[0] != local_a8) {
                  operator_delete(local_b8[0],local_a8[0] + 1);
                }
                if (iVar2 != 0) {
                  lVar8 = 0x28;
                  pcVar9 = "Patch with defaults contains wrong value";
                  goto LAB_00108d12;
                }
                bVar1 = true;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Patch with defaults contains wrong path. It is ",
                           0x2f);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_108._M_unused._0_8_,
                                    local_108._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," and should be ",0xf);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/address/street",0xf);
LAB_00108d27:
                std::endl<char,std::char_traits<char>>(poVar6);
                bVar1 = false;
              }
              if ((_Manager_type *)local_108._M_unused._0_8_ != &local_f8) {
                operator_delete(local_108._M_unused._M_object,(ulong)(local_f8 + 1));
              }
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_c8);
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)(local_e0 + 8));
              uVar7 = 1;
              if (!bVar1) goto LAB_00108c64;
              local_f8 = (_Manager_type)0x0;
              uStack_f0 = 0;
              local_108._M_unused._M_object = (_Manager_type *)0x0;
              local_108._8_8_ = 0;
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::parse<char_const*>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_b8,"{\n\t\t\"name\": \"Hans\",\n\t\t\"age\": 69\n\t\t}","",
                         (parser_callback_t *)&local_108,true,false);
              if (local_f8 != (_Manager_type)0x0) {
                (*local_f8)(&local_108,&local_108,__destroy_functor);
              }
              nlohmann::json_schema::json_validator::validate
                        ((json_validator *)(local_e0 + 8),(json *)local_e0);
              if (local_d8.boolean == true) {
                if (local_d0[1] - *local_d0 != 0x10) {
                  lVar8 = 0x39;
                  pcVar9 = "Patch with defaults is expected to contain one opperation";
                  goto LAB_00108eda;
                }
                pvVar3 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)(local_e0 + 8),0);
                lVar8 = 0x3b;
                pcVar9 = "Patch with defaults is expected to contain opperation entry";
                if (pvVar3->m_type == object) {
                  cVar4 = std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          ::_M_find_tr<char[3],void>
                                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                      *)(pvVar3->m_value).object,(char (*) [3])"op");
                  if ((_Rb_tree_header *)cVar4._M_node ==
                      &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)
                  goto LAB_00108e79;
                  pvVar5 = nlohmann::json_abi_v3_11_2::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                       *)pvVar3,"op");
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_108,pvVar5);
                  iVar2 = std::__cxx11::string::compare(local_108._M_pod_data);
                  if ((_Manager_type *)local_108._M_unused._0_8_ != &local_f8) {
                    operator_delete(local_108._M_unused._M_object,(ulong)(local_f8 + 1));
                  }
                  if (iVar2 != 0) {
                    lVar8 = 0x39;
                    pcVar9 = "Patch with defaults is expected to contain add opperation";
                    goto LAB_00108e79;
                  }
                  if (pvVar3->m_type == object) {
                    cVar4 = std::
                            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            ::_M_find_tr<char[5],void>
                                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                        *)(pvVar3->m_value).object,(char (*) [5])0x13fbc7);
                    if ((_Rb_tree_header *)cVar4._M_node ==
                        &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)
                    goto LAB_00108ff2;
                    pvVar5 = nlohmann::json_abi_v3_11_2::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                         *)pvVar3,"path");
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_108,pvVar5);
                    iVar2 = std::__cxx11::string::compare(local_108._M_pod_data);
                    if (iVar2 == 0) {
                      lVar8 = 0x32;
                      pcVar9 = "Patch with defaults is expected to contain a value";
                      if (pvVar3->m_type != object) {
LAB_001090ac:
                        poVar6 = (ostream *)&std::cerr;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,pcVar9,lVar8);
                        goto LAB_001090c1;
                      }
                      cVar4 = std::
                              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              ::_M_find_tr<char[6],void>
                                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                          *)(pvVar3->m_value).object,(char (*) [6])0x13fc49);
                      if ((_Rb_tree_header *)cVar4._M_node ==
                          &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)
                      goto LAB_001090ac;
                      pvVar5 = nlohmann::json_abi_v3_11_2::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           *)pvVar3,"value");
                      lVar8 = 0x28;
                      pcVar9 = "Patch with defaults contains wrong value";
                      if (pvVar5->m_type != object) goto LAB_001090ac;
                      pvVar3 = nlohmann::json_abi_v3_11_2::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           *)pvVar3,"value");
                      uVar7 = (uint)pvVar3->m_type;
                      if (pvVar3->m_type != null) {
                        if (uVar7 == 2) {
                          if ((((pvVar3->m_value).array)->
                              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start !=
                              (((pvVar3->m_value).array)->
                              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001090ac;
                        }
                        else if ((uVar7 != 1) ||
                                ((((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                                 _M_node_count != 0)) goto LAB_001090ac;
                        uVar7 = 0;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Patch with defaults contains wrong path. It is ",0x2f);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,(char *)local_108._M_unused._0_8_,
                                          local_108._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," and should be ",0xf);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/address",8);
LAB_001090c1:
                      uVar7 = 1;
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    if ((_Manager_type *)local_108._M_unused._0_8_ != &local_f8) {
                      operator_delete(local_108._M_unused._M_object,(ulong)(local_f8 + 1));
                    }
                  }
                  else {
LAB_00108ff2:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "Patch with defaults is expected to contain a path",0x31);
                    uVar7 = 1;
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                  }
                }
                else {
LAB_00108e79:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar9,lVar8);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  uVar7 = 1;
                  std::ostream::flush();
                }
              }
              else {
                lVar8 = 0x2e;
                pcVar9 = "Patch with defaults is expected to be an array";
LAB_00108eda:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar9,lVar8);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
                std::ostream::put(-0x28);
                uVar7 = 1;
                std::ostream::flush();
              }
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)(local_e0 + 8));
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_b8);
              goto LAB_00108c64;
            }
          }
        }
        else {
          lVar8 = 0x39;
          pcVar9 = "Patch with defaults is expected to contain add opperation";
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  else {
    lVar8 = 0x2e;
    pcVar9 = "Patch with defaults is expected to be an array";
LAB_00108b07:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_c8);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_e0 + 8));
  uVar7 = 1;
LAB_00108c64:
  nlohmann::json_schema::json_validator::~json_validator((json_validator *)local_e0);
  return uVar7;
}

Assistant:

int main(void)
{
	json_validator validator{};
	validator.set_root_schema(person_schema);

	{
		// add address which is optional that should generate a diff containing a default street
		json person_emtpy_address = R"({
		"name": "Hans",
		"age": 69,
		"address": {}
		})"_json;

		const auto default_patch = validator.validate(person_emtpy_address);

		if (!default_patch.is_array()) {
			std::cerr << "Patch with defaults is expected to be an array" << std::endl;
			return 1;
		}

		if (default_patch.size() != 1) {
			std::cerr << "Patch with defaults is expected to contain one opperation" << std::endl;
			return 1;
		}

		const auto &single_op = default_patch[0];

		if (!single_op.contains("op")) {
			std::cerr << "Patch with defaults is expected to contain opperation entry" << std::endl;
			return 1;
		}

		if (single_op["op"].get<std::string>() != "add") {
			std::cerr << "Patch with defaults is expected to contain add opperation" << std::endl;
			return 1;
		}

		if (!single_op.contains("path")) {
			std::cerr << "Patch with defaults is expected to contain a path" << std::endl;
			return 1;
		}

		const auto &readPath = single_op["path"].get<std::string>();
		if (readPath != "/address/street") {
			std::cerr << "Patch with defaults contains wrong path. It is " << readPath << " and should be "
			          << "/address/street" << std::endl;
			return 1;
		}

		if (!single_op.contains("value")) {
			std::cerr << "Patch with defaults is expected to contain a value" << std::endl;
			return 1;
		}

		if (single_op["value"].get<std::string>() != "Abbey Road") {
			std::cerr << "Patch with defaults contains wrong value" << std::endl;
			return 1;
		}
	}
	{
		// add address which is optional that should generate a diff containing a empty object
		// but not work address which is null or other address which has no default
		json person_missing_address = R"({
		"name": "Hans",
		"age": 69
		})"_json;

		const auto default_patch = validator.validate(person_missing_address);

		if (!default_patch.is_array()) {
			std::cerr << "Patch with defaults is expected to be an array" << std::endl;
			return 1;
		}

		if (default_patch.size() != 1) {
			std::cerr << "Patch with defaults is expected to contain one opperation" << std::endl;
			return 1;
		}

		const auto &single_op = default_patch[0];

		if (!single_op.contains("op")) {
			std::cerr << "Patch with defaults is expected to contain opperation entry" << std::endl;
			return 1;
		}

		if (single_op["op"].get<std::string>() != "add") {
			std::cerr << "Patch with defaults is expected to contain add opperation" << std::endl;
			return 1;
		}

		if (!single_op.contains("path")) {
			std::cerr << "Patch with defaults is expected to contain a path" << std::endl;
			return 1;
		}

		const auto &readPath = single_op["path"].get<std::string>();
		if (readPath != "/address") {
			std::cerr << "Patch with defaults contains wrong path. It is " << readPath << " and should be "
			          << "/address" << std::endl;
			return 1;
		}

		if (!single_op.contains("value")) {
			std::cerr << "Patch with defaults is expected to contain a value" << std::endl;
			return 1;
		}

		if (!single_op["value"].is_object() || !single_op["value"].empty()) {
			std::cerr << "Patch with defaults contains wrong value" << std::endl;
			return 1;
		}
	}
	return 0;
}